

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

int Shirt_on(void)

{
  boolean bVar1;
  
  if (uarmu != (obj *)0x0) {
    Oprops_on(uarmu,0x40);
    if (uarmu != (obj *)0x0) {
      bVar1 = is_racial_armor(uarmu,&youmonst);
      if (bVar1 == '\0') {
        u.uconduct.unracearmor = u.uconduct.unracearmor + 1;
      }
    }
  }
  return 0;
}

Assistant:

static int Shirt_on(void)
{
    if (!uarmu) return 0;

    Oprops_on(uarmu, WORN_SHIRT);

    if (uarmu && !is_racial_armor(uarmu, &youmonst))
	u.uconduct.unracearmor++;

    /* discover_cursed_equip() called by dowear() */

    return 0;
}